

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::SetImportLocationProperty
          (cmExportBuildFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *this_00;
  undefined8 this_01;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  reference ppcVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  undefined1 local_218 [8];
  string value_1;
  undefined1 local_1f0 [8];
  string prop_2;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168 [8];
  string value;
  undefined1 local_140 [8];
  string prop_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string *local_e0;
  string *obj;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_d0;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_c8;
  const_iterator si;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string obj_dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  allocator local_59;
  undefined1 local_58 [8];
  string prop;
  cmMakefile *mf;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  string *config_local;
  cmExportBuildFileGenerator *this_local;
  
  prop.field_2._8_8_ = target->Makefile;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == OBJECT_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_58,"IMPORTED_OBJECTS",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::operator+=((string *)local_58,(string *)suffix);
    this_00 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
              ((long)&obj_dir.field_2 + 8);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(this_00);
    cmGeneratorTarget::GetObjectSources(target,this_00,config);
    cmGeneratorTarget::GetObjectDirectory
              ((string *)
               &objects.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,target,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&si);
    local_d0._M_current =
         (cmSourceFile **)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    ((long)&obj_dir.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
    ::__normal_iterator<cmSourceFile_const**>
              ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                *)&local_c8,&local_d0);
    while( true ) {
      obj = (string *)
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       ((long)&obj_dir.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                          *)&obj);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&local_c8);
      local_e0 = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,*ppcVar4);
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &objects.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&si,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&local_c8);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)((long)&prop_1.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&si,";");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_58);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)(prop_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(prop_1.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&si);
    std::__cxx11::string::~string
              ((string *)
               &objects.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               ((long)&obj_dir.field_2 + 8));
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_140,"IMPORTED_LOCATION",
               (allocator *)(value.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(value.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_140,(string *)suffix);
    std::__cxx11::string::string(local_168);
    bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target);
    if (bVar1) {
      cmGeneratorTarget::GetFullPath(&local_188,target,config,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=(local_168,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
    else {
      cmGeneratorTarget::GetFullPath(&local_1a8,target,config,RuntimeBinaryArtifact,true);
      std::__cxx11::string::operator=(local_168,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_140);
    std::__cxx11::string::operator=((string *)pmVar5,local_168);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string((string *)local_140);
    bVar2 = cmGeneratorTarget::HasImportLibrary(target);
    this_01 = prop.field_2._8_8_;
    prop_2.field_2._M_local_buf[0xe] = '\0';
    prop_2.field_2._M_local_buf[0xd] = '\0';
    bVar1 = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      prop_2.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string
                ((string *)&local_1c8,"CMAKE_IMPORT_LIBRARY_SUFFIX",
                 (allocator *)(prop_2.field_2._M_local_buf + 0xf));
      prop_2.field_2._M_local_buf[0xd] = '\x01';
      pcVar6 = cmMakefile::GetDefinition((cmMakefile *)this_01,&local_1c8);
      bVar1 = pcVar6 != (char *)0x0;
    }
    if ((prop_2.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    if ((prop_2.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(prop_2.field_2._M_local_buf + 0xf));
    }
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1f0,"IMPORTED_IMPLIB",
                 (allocator *)(value_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(value_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_1f0,(string *)suffix);
      cmGeneratorTarget::GetFullPath((string *)local_218,target,config,ImportLibraryArtifact,false);
      cmGeneratorTarget::GetImplibGNUtoMS
                (target,(string *)local_218,(string *)local_218,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_1f0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)local_218);
      std::__cxx11::string::~string((string *)local_218);
      std::__cxx11::string::~string((string *)local_1f0);
    }
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = "IMPORTED_OBJECTS";
    prop += suffix;

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (std::vector<cmSourceFile const*>::const_iterator si =
           objectSources.begin();
         si != objectSources.end(); ++si) {
      const std::string& obj = target->GetObjectName(*si);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = "IMPORTED_LOCATION";
      prop += suffix;
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary() &&
        mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
      std::string prop = "IMPORTED_IMPLIB";
      prop += suffix;
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      target->GetImplibGNUtoMS(value, value, "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      properties[prop] = value;
    }
  }
}